

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::ImageInfiniteLight::Phi(ImageInfiniteLight *this,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  WrapMode2D wrapMode;
  array<float,_4> aVar3;
  Point2i PVar4;
  Float *pFVar5;
  SampledSpectrum *in_RDI;
  undefined1 auVar6 [64];
  undefined1 auVar9 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar12 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  SampledSpectrum SVar13;
  int c;
  RGB rgb;
  int u;
  int v;
  int height;
  int width;
  SampledSpectrum sumL;
  SampledSpectrum *in_stack_ffffffffffffff28;
  float *in_stack_ffffffffffffff30;
  Float a;
  undefined4 in_stack_ffffffffffffff38;
  Float in_stack_ffffffffffffff3c;
  SampledSpectrum local_a8;
  SampledWavelengths *in_stack_ffffffffffffff68;
  RGBSpectrum *in_stack_ffffffffffffff70;
  RGB *in_stack_ffffffffffffff90;
  RGBColorSpace *in_stack_ffffffffffffff98;
  int c_00;
  Float in_stack_ffffffffffffffa4;
  Image *in_stack_ffffffffffffffa8;
  int local_50;
  WrapMode WVar14;
  WrapMode WVar15;
  int iVar16;
  int iVar17;
  int local_3c;
  
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)in_stack_ffffffffffffff30,
             (Float)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  PVar4 = Image::Resolution((Image *)(in_RDI[0xb].values.values + 2));
  local_3c = PVar4.super_Tuple2<pbrt::Point2,_int>.x;
  PVar4 = Image::Resolution((Image *)(in_RDI[0xb].values.values + 2));
  WVar15 = PVar4.super_Tuple2<pbrt::Point2,_int>.x;
  iVar16 = PVar4.super_Tuple2<pbrt::Point2,_int>.y;
  iVar17 = iVar16;
  for (WVar14 = Repeat; a = (Float)((ulong)in_stack_ffffffffffffff30 >> 0x20), (int)WVar14 < iVar17;
      WVar14 = WVar14 + Black) {
    for (local_50 = 0; local_50 < local_3c; local_50 = local_50 + 1) {
      RGB::RGB((RGB *)&stack0xffffffffffffffa4);
      c_00 = 0;
      while( true ) {
        auVar12 = in_ZMM1._8_56_;
        auVar9 = auVar6._8_56_;
        if (2 < c_00) break;
        in_stack_ffffffffffffff30 = in_RDI[0xb].values.values + 2;
        Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffff30,
                            (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                            (int)in_stack_ffffffffffffff28);
        in_stack_ffffffffffffff90 = *(RGB **)(in_RDI[0x1d].values.values + 3);
        PVar4.super_Tuple2<pbrt::Point2,_int>.y = iVar17;
        PVar4.super_Tuple2<pbrt::Point2,_int>.x = iVar16;
        wrapMode.wrap.values[1] = WVar15;
        wrapMode.wrap.values[0] = WVar14;
        in_stack_ffffffffffffff3c =
             Image::GetChannel(in_stack_ffffffffffffffa8,PVar4,(int)in_stack_ffffffffffffffa4,
                               wrapMode);
        pFVar5 = RGB::operator[]((RGB *)&stack0xffffffffffffffa4,c_00);
        auVar6 = ZEXT464((uint)in_stack_ffffffffffffff3c);
        *pFVar5 = in_stack_ffffffffffffff3c;
        c_00 = c_00 + 1;
      }
      in_stack_ffffffffffffff28 = &local_a8;
      RGBSpectrum::RGBSpectrum
                ((RGBSpectrum *)CONCAT44(in_stack_ffffffffffffffa4,c_00),in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff90);
      SVar13 = RGBSpectrum::Sample(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      in_ZMM1._0_8_ = SVar13.values.values._8_8_;
      in_ZMM1._8_56_ = auVar12;
      auVar6._0_8_ = SVar13.values.values._0_8_;
      auVar6._8_56_ = auVar9;
      vmovlpd_avx(auVar6._0_16_);
      vmovlpd_avx(in_ZMM1._0_16_);
      SampledSpectrum::operator+=
                (in_RDI,(SampledSpectrum *)
                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
  }
  Sqr<float>(in_RDI[0x1f].values.values[0]);
  auVar12 = (undefined1  [56])0x0;
  auVar9 = (undefined1  [56])0x0;
  SVar13 = pbrt::operator*(a,in_stack_ffffffffffffff28);
  auVar10._0_8_ = SVar13.values.values._8_8_;
  auVar10._8_56_ = auVar12;
  auVar7._0_8_ = SVar13.values.values._0_8_;
  auVar7._8_56_ = auVar9;
  vmovlpd_avx(auVar7._0_16_);
  vmovlpd_avx(auVar10._0_16_);
  auVar9 = ZEXT856(auVar9._0_8_);
  SVar13 = SampledSpectrum::operator/
                     ((SampledSpectrum *)
                      CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),a);
  auVar11._0_8_ = SVar13.values.values._8_8_;
  auVar11._8_56_ = auVar12;
  auVar8._0_8_ = SVar13.values.values._0_8_;
  auVar8._8_56_ = auVar9;
  uVar1 = vmovlpd_avx(auVar8._0_16_);
  uVar2 = vmovlpd_avx(auVar11._0_16_);
  aVar3.values[2] = (float)(int)uVar2;
  aVar3.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
  aVar3.values[0] = (float)(int)uVar1;
  aVar3.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

SampledSpectrum ImageInfiniteLight::Phi(const SampledWavelengths &lambda) const {
    // We're really computing fluence, then converting to power, for what
    // that's worth..
    SampledSpectrum sumL(0.);

    int width = image.Resolution().x, height = image.Resolution().y;
    for (int v = 0; v < height; ++v) {
        for (int u = 0; u < width; ++u) {
            RGB rgb;
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.GetChannel({u, v}, c, wrapMode);
            sumL += RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);
        }
    }
    // Integrating over the sphere, so 4pi for that.  Then one more for Pi
    // r^2 for the area of the disk receiving illumination...
    return 4 * Pi * Pi * Sqr(sceneRadius) * scale * sumL / (width * height);
}